

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solid.cpp
# Opt level: O2

bool __thiscall MeshLib::Solid::collapsable(Solid *this,HalfEdge *halfedge)

{
  HalfEdge *pHVar1;
  Face *pFVar2;
  Face *pFVar3;
  Vertex *pVVar4;
  Vertex *this_00;
  Vertex *pVVar5;
  bool bVar6;
  tVertex pVVar7;
  Face *pFVar8;
  bool bVar9;
  List<MeshLib::Vertex> verts;
  HalfEdge *he;
  vector<MeshLib::HalfEdge_*,_std::allocator<MeshLib::HalfEdge_*>_> thlist;
  VertexInHalfedgeIterator local_a0;
  VertexVertexIterator local_88;
  _Vector_base<MeshLib::HalfEdge_*,_std::allocator<MeshLib::HalfEdge_*>_> local_78;
  Vertex *local_58;
  Vertex *local_50;
  Edge *local_48;
  Vertex *local_40;
  Vertex *local_38;
  
  local_48 = halfedge->m_edge;
  local_a0.m_vertex = halfedge->m_vertex;
  pHVar1 = local_48->m_halfedge[local_48->m_halfedge[0] == halfedge];
  if (pHVar1 == (HalfEdge *)0x0) {
    pFVar8 = (Face *)0x0;
    local_38 = (Vertex *)0x0;
  }
  else {
    pFVar8 = pHVar1->m_face;
    local_38 = pHVar1->m_next->m_vertex;
  }
  pFVar2 = halfedge->m_face;
  local_58 = halfedge->m_prev->m_vertex;
  local_50 = halfedge->m_next->m_vertex;
  local_78._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a0.m_solid = this;
  local_40 = local_a0.m_vertex;
  local_a0.m_halfedge = Vertex::most_clw_in_halfedge(local_a0.m_vertex);
  while ((Vertex *)local_a0.m_halfedge != (Vertex *)0x0) {
    pFVar3 = (Face *)((Point *)&(local_a0.m_halfedge)->m_face)->v[0];
    local_88.m_vertex = (tVertex)local_a0.m_halfedge;
    if ((pFVar3 != pFVar2) && (pFVar3 != pFVar8)) {
      std::vector<MeshLib::HalfEdge_*,_std::allocator<MeshLib::HalfEdge_*>_>::push_back
                ((vector<MeshLib::HalfEdge_*,_std::allocator<MeshLib::HalfEdge_*>_> *)&local_78,
                 (value_type *)&local_88);
    }
    VertexInHalfedgeIterator::operator++(&local_a0);
  }
  local_a0.m_vertex = local_58;
  local_a0.m_solid = this;
  local_a0.m_halfedge = Vertex::most_clw_in_halfedge(local_58);
  while ((Vertex *)local_a0.m_halfedge != (Vertex *)0x0) {
    pFVar3 = (Face *)((Point *)&(local_a0.m_halfedge)->m_face)->v[0];
    local_88.m_vertex = (tVertex)local_a0.m_halfedge;
    if ((pFVar3 != pFVar2) && (pFVar3 != pFVar8)) {
      std::vector<MeshLib::HalfEdge_*,_std::allocator<MeshLib::HalfEdge_*>_>::push_back
                ((vector<MeshLib::HalfEdge_*,_std::allocator<MeshLib::HalfEdge_*>_> *)&local_78,
                 (value_type *)&local_88);
    }
    VertexInHalfedgeIterator::operator++(&local_a0);
  }
  if (local_78._M_impl.super__Vector_impl_data._M_finish !=
      local_78._M_impl.super__Vector_impl_data._M_start) {
    local_78._M_impl.super__Vector_impl_data._M_finish =
         local_78._M_impl.super__Vector_impl_data._M_start;
    local_a0.m_vertex = local_50;
    local_a0.m_solid = this;
    local_a0.m_halfedge = Vertex::most_clw_in_halfedge(local_50);
    while (pVVar5 = local_38, (Vertex *)local_a0.m_halfedge != (Vertex *)0x0) {
      pFVar3 = (Face *)((Point *)&(local_a0.m_halfedge)->m_face)->v[0];
      local_88.m_vertex = (tVertex)local_a0.m_halfedge;
      if ((pFVar3 != pFVar2) && (pFVar3 != pFVar8)) {
        std::vector<MeshLib::HalfEdge_*,_std::allocator<MeshLib::HalfEdge_*>_>::push_back
                  ((vector<MeshLib::HalfEdge_*,_std::allocator<MeshLib::HalfEdge_*>_> *)&local_78,
                   (value_type *)&local_88);
      }
      VertexInHalfedgeIterator::operator++(&local_a0);
    }
    if (local_78._M_impl.super__Vector_impl_data._M_finish !=
        local_78._M_impl.super__Vector_impl_data._M_start) {
      if (local_38 != (Vertex *)0x0) {
        local_78._M_impl.super__Vector_impl_data._M_finish =
             local_78._M_impl.super__Vector_impl_data._M_start;
        local_a0.m_vertex = local_38;
        local_a0.m_solid = this;
        local_a0.m_halfedge = Vertex::most_clw_in_halfedge(local_38);
        while ((Vertex *)local_a0.m_halfedge != (Vertex *)0x0) {
          pFVar3 = (Face *)((Point *)&(local_a0.m_halfedge)->m_face)->v[0];
          local_88.m_vertex = (tVertex)local_a0.m_halfedge;
          if ((pFVar3 != pFVar2) && (pFVar3 != pFVar8)) {
            std::vector<MeshLib::HalfEdge_*,_std::allocator<MeshLib::HalfEdge_*>_>::push_back
                      ((vector<MeshLib::HalfEdge_*,_std::allocator<MeshLib::HalfEdge_*>_> *)
                       &local_78,(value_type *)&local_88);
          }
          VertexInHalfedgeIterator::operator++(&local_a0);
        }
        if (local_78._M_impl.super__Vector_impl_data._M_finish ==
            local_78._M_impl.super__Vector_impl_data._M_start) goto LAB_0010faf7;
      }
      this_00 = local_40;
      if (((local_58->m_boundary != true) || (local_40->m_boundary != true)) ||
         ((local_48->m_halfedge[0] == (HalfEdge *)0x0) !=
          (local_48->m_halfedge[1] == (HalfEdge *)0x0))) {
        local_a0.m_solid = (Solid *)0x0;
        local_a0.m_vertex = (tVertex)((ulong)local_a0.m_vertex & 0xffffffff00000000);
        local_88.m_vertex = local_58;
        local_88.m_halfedge = Vertex::most_clw_out_halfedge(local_58);
        pVVar4 = local_50;
        while (local_88.m_halfedge != (HalfEdge *)0x0) {
          pVVar7 = VertexVertexIterator::value(&local_88);
          if ((pVVar7 != pVVar4) && (pVVar7 != pVVar5)) {
            List<MeshLib::Vertex>::Append((List<MeshLib::Vertex> *)&local_a0,pVVar7);
          }
          VertexVertexIterator::operator++(&local_88);
        }
        local_88.m_vertex = this_00;
        local_88.m_halfedge = Vertex::most_clw_out_halfedge(this_00);
        while (bVar9 = local_88.m_halfedge == (HalfEdge *)0x0, !bVar9) {
          pVVar7 = VertexVertexIterator::value(&local_88);
          bVar6 = List<MeshLib::Vertex>::contains((List<MeshLib::Vertex> *)&local_a0,pVVar7);
          if (bVar6) break;
          VertexVertexIterator::operator++(&local_88);
        }
        List<MeshLib::Vertex>::~List((List<MeshLib::Vertex> *)&local_a0);
        goto LAB_0010fb4e;
      }
    }
  }
LAB_0010faf7:
  bVar9 = false;
LAB_0010fb4e:
  std::_Vector_base<MeshLib::HalfEdge_*,_std::allocator<MeshLib::HalfEdge_*>_>::~_Vector_base
            (&local_78);
  return bVar9;
}

Assistant:

bool Solid::collapsable (HalfEdge * halfedge) {
	Edge * edge = halfedge->edge ();
	Vertex * source = halfedge->source ();
	Vertex * target = halfedge->target ();
	Face * fL = halfedge->face ();
	Face * fR = halfedge->he_sym ()!= NULL?halfedge->he_sym()->face ():NULL;
	Vertex * vL = halfedge->he_next ()->target ();
	Vertex * vR = halfedge->he_sym ()!= NULL? halfedge->he_sym ()->he_next ()->target ():NULL;
	std::vector <HalfEdge *> thlist;
	for( VertexInHalfedgeIterator vhiter( this, target );!vhiter.end(); ++ vhiter ) {
		HalfEdge * he = *vhiter;

		if( he->face() == fL ) continue;
		if( he->face() == fR ) continue;

		thlist.push_back ( he );
	}

	for( VertexInHalfedgeIterator svhiter( this, source );!svhiter.end(); ++ svhiter ) {
		HalfEdge * he = *svhiter;

		if( he->face() == fL ) continue;
		if( he->face() == fR ) continue;

		thlist.push_back ( he );
	}
	if(thlist.size () == 0) return false;

	thlist.clear ();
	for( VertexInHalfedgeIterator lvhiter( this, vL );!lvhiter.end(); ++ lvhiter )
	{
		HalfEdge * he = *lvhiter;

		if( he->face() == fL ) continue;
		if( he->face() == fR ) continue;

		thlist.push_back ( he );
	}
	if(thlist.size () == 0) return false;
	if( vR != NULL ) {
		thlist.clear ();
		for( VertexInHalfedgeIterator rvhiter( this, vR );!rvhiter.end(); ++ rvhiter ) {
			HalfEdge * he = *rvhiter;

			if( he->face() == fL ) continue;
			if( he->face() == fR ) continue;

			thlist.push_back ( he );
		}
		if(thlist.size () == 0) return false;
	}

	if( source->boundary() && target->boundary() && !edge->boundary() )
		return false;

	List<Vertex> verts;

	for( VertexVertexIterator vviter( source ); !vviter.end(); ++ vviter ) {
		Vertex * v = *vviter;
		if( v == vL ) continue;
		if( v == vR ) continue;
		verts.Append( v );
	}

	for( VertexVertexIterator viter(  target ); !viter.end(); ++ viter ) {
		Vertex * v = *viter;
		if( verts.contains( v ) ) return false;
	}

	return true;
}